

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeaderStructs.cpp
# Opt level: O2

void readPic<PicHeaderPS3>(istream *stream,PicHeader *header)

{
  pointer pPVar1;
  PicChunkPS3 PVar2;
  PicChunk *chunk;
  pointer pPVar3;
  PicHeaderPS3 h;
  PicHeaderPS3 local_30;
  
  header->isSwitch = false;
  readRaw<PicHeaderPS3>(&local_30,stream);
  header->filesize = (uint32_t)local_30.filesize.value_;
  header->version = 0;
  header->ew = (uint16_t)local_30.ew.value_;
  header->eh = (uint16_t)local_30.eh.value_;
  header->width = (uint16_t)local_30.width.value_;
  header->height = (uint16_t)local_30.height.value_;
  std::vector<PicChunk,_std::allocator<PicChunk>_>::resize
            (&header->chunks,(ulong)(uint)local_30.chunks.value_);
  std::istream::ignore((long)stream);
  pPVar1 = (header->chunks).super__Vector_base<PicChunk,_std::allocator<PicChunk>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pPVar3 = (header->chunks).super__Vector_base<PicChunk,_std::allocator<PicChunk>_>._M_impl.
                super__Vector_impl_data._M_start; pPVar3 != pPVar1; pPVar3 = pPVar3 + 1) {
    PVar2 = readRaw<PicChunkPS3>(stream);
    pPVar3->x = (uint16_t)PVar2.x.value_.value_;
    pPVar3->y = (uint16_t)PVar2.y.value_.value_;
    pPVar3->offset = (uint32_t)PVar2.offset.value_.value_;
    pPVar3->size = 0;
  }
  return;
}

Assistant:

void readPic(std::istream& stream, PicHeader& header) {
	header.isSwitch = Header::IsSwitch::value;
	Header h = readRaw<Header>(stream);
	header.filesize = h.filesize.value();
	header.version = h.getVersion();
	header.eh = h.eh.value();
	header.ew = h.ew.value();
	header.width = h.width.value();
	header.height = h.height.value();
	header.chunks.resize(h.chunks.value());

	stream.ignore(h.bytesToSkip());

	for (auto& chunk : header.chunks) {
		auto c = readRaw<typename Header::Chunk>(stream);
		chunk.x = c.x.value();
		chunk.y = c.y.value();
		chunk.offset = c.offset.value();
		chunk.size = c.getSize();
	}
}